

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_reflect.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerReflection::emit_type_member_qualifiers
          (CompilerReflection *this,SPIRType *type,uint32_t index)

{
  Decoration *pDVar1;
  Stream *pSVar2;
  bool bVar3;
  uint32_t value;
  SPIRType *type_00;
  mapped_type *pmVar4;
  uint64_t uVar5;
  ulong uVar6;
  allocator local_51;
  string local_50;
  
  uVar6 = (ulong)index;
  type_00 = Compiler::get<spirv_cross::SPIRType>
                      ((Compiler *)this,
                       (type->member_types).
                       super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[uVar6].id)
  ;
  emit_type_array(this,type_00);
  pmVar4 = ::std::__detail::
           _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&(this->super_CompilerGLSL).super_Compiler.ir.meta,
                        &(type->super_IVariant).self);
  if (uVar6 < (pmVar4->members).super_VectorView<spirv_cross::Meta::Decoration>.buffer_size) {
    pDVar1 = (pmVar4->members).super_VectorView<spirv_cross::Meta::Decoration>.ptr;
    uVar5 = pDVar1[uVar6].decoration_flags.lower;
    if (((uint)uVar5 >> 0x1e & 1) != 0) {
      pSVar2 = (this->json_stream).
               super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      ::std::__cxx11::string::string((string *)&local_50,"location",&local_51);
      simple_json::Stream::emit_json_key_value(pSVar2,&local_50,pDVar1[uVar6].location);
      ::std::__cxx11::string::~string((string *)&local_50);
      uVar5 = pDVar1[uVar6].decoration_flags.lower;
    }
    if ((uVar5 >> 0x23 & 1) != 0) {
      pSVar2 = (this->json_stream).
               super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      ::std::__cxx11::string::string((string *)&local_50,"offset",&local_51);
      simple_json::Stream::emit_json_key_value(pSVar2,&local_50,pDVar1[uVar6].offset);
      ::std::__cxx11::string::~string((string *)&local_50);
    }
    bVar3 = Compiler::has_decoration
                      ((Compiler *)this,
                       (ID)(type->member_types).
                           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[uVar6]
                           .id,DecorationArrayStride);
    if (bVar3) {
      pSVar2 = (this->json_stream).
               super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      ::std::__cxx11::string::string((string *)&local_50,"array_stride",&local_51);
      value = Compiler::get_decoration
                        ((Compiler *)this,
                         (ID)(type->member_types).
                             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
                             [uVar6].id,DecorationArrayStride);
      simple_json::Stream::emit_json_key_value(pSVar2,&local_50,value);
      ::std::__cxx11::string::~string((string *)&local_50);
    }
    uVar5 = pDVar1[uVar6].decoration_flags.lower;
    if ((char)uVar5 < '\0') {
      pSVar2 = (this->json_stream).
               super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      ::std::__cxx11::string::string((string *)&local_50,"matrix_stride",&local_51);
      simple_json::Stream::emit_json_key_value(pSVar2,&local_50,pDVar1[uVar6].matrix_stride);
      ::std::__cxx11::string::~string((string *)&local_50);
      uVar5 = pDVar1[uVar6].decoration_flags.lower;
    }
    if ((uVar5 & 0x10) != 0) {
      pSVar2 = (this->json_stream).
               super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      ::std::__cxx11::string::string((string *)&local_50,"row_major",&local_51);
      simple_json::Stream::emit_json_key_value(pSVar2,&local_50,true);
      ::std::__cxx11::string::~string((string *)&local_50);
    }
    bVar3 = Compiler::type_is_top_level_physical_pointer((Compiler *)this,type_00);
    if (bVar3) {
      pSVar2 = (this->json_stream).
               super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      ::std::__cxx11::string::string((string *)&local_50,"physical_pointer",&local_51);
      simple_json::Stream::emit_json_key_value(pSVar2,&local_50,true);
      ::std::__cxx11::string::~string((string *)&local_50);
    }
  }
  return;
}

Assistant:

void CompilerReflection::emit_type_member_qualifiers(const SPIRType &type, uint32_t index)
{
	auto &membertype = get<SPIRType>(type.member_types[index]);
	emit_type_array(membertype);
	auto &memb = ir.meta[type.self].members;
	if (index < memb.size())
	{
		auto &dec = memb[index];
		if (dec.decoration_flags.get(DecorationLocation))
			json_stream->emit_json_key_value("location", dec.location);
		if (dec.decoration_flags.get(DecorationOffset))
			json_stream->emit_json_key_value("offset", dec.offset);

		// Array stride is a property of the array type, not the struct.
		if (has_decoration(type.member_types[index], DecorationArrayStride))
			json_stream->emit_json_key_value("array_stride",
			                                 get_decoration(type.member_types[index], DecorationArrayStride));

		if (dec.decoration_flags.get(DecorationMatrixStride))
			json_stream->emit_json_key_value("matrix_stride", dec.matrix_stride);
		if (dec.decoration_flags.get(DecorationRowMajor))
			json_stream->emit_json_key_value("row_major", true);

		if (type_is_top_level_physical_pointer(membertype))
			json_stream->emit_json_key_value("physical_pointer", true);
	}
}